

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  undefined8 uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 (*pauVar17) [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  float fVar39;
  float fVar40;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar41;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  vint4 bi;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  float fVar60;
  float fVar61;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar76;
  undefined1 auVar73 [16];
  float fVar77;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar78;
  float fVar80;
  float fVar81;
  undefined1 auVar79 [16];
  float fVar82;
  vint4 ai;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  vint4 bi_1;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  vint4 ai_3;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  vint4 ai_1;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  Intersectors *local_10a0;
  Precalculations *local_1098;
  RayHitK<4> *local_1090;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1098 = pre;
  local_10a0 = This;
  pauVar21 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar87 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar88 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  local_ff8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  local_1008 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar99 = fVar86 * 0.99999964;
  fVar78 = fVar89 * 0.99999964;
  fVar98 = fVar94 * 0.99999964;
  fVar86 = fVar86 * 1.0000004;
  fVar89 = fVar89 * 1.0000004;
  fVar94 = fVar94 * 1.0000004;
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar42 = (tray->tnear).field_0.i[k];
  auVar50._4_4_ = iVar42;
  auVar50._0_4_ = iVar42;
  auVar50._8_4_ = iVar42;
  auVar50._12_4_ = iVar42;
  iVar42 = (tray->tfar).field_0.i[k];
  local_1038 = fVar87;
  fStack_1034 = fVar87;
  fStack_1030 = fVar87;
  fStack_102c = fVar87;
  local_10b8 = fVar88;
  fStack_10b4 = fVar88;
  fStack_10b0 = fVar88;
  fStack_10ac = fVar88;
  local_1048 = fVar86;
  fStack_1044 = fVar86;
  fStack_1040 = fVar86;
  fStack_103c = fVar86;
  local_1058 = fVar89;
  fStack_1054 = fVar89;
  fStack_1050 = fVar89;
  fStack_104c = fVar89;
  local_1068 = fVar94;
  fStack_1064 = fVar94;
  fStack_1060 = fVar94;
  fStack_105c = fVar94;
  local_1078 = fVar98;
  fStack_1074 = fVar98;
  fStack_1070 = fVar98;
  fStack_106c = fVar98;
  local_1088 = fVar99;
  fStack_1084 = fVar99;
  fStack_1080 = fVar99;
  fStack_107c = fVar99;
  local_10c8 = fVar78;
  fStack_10c4 = fVar78;
  fStack_10c0 = fVar78;
  fStack_10bc = fVar78;
  local_10d8 = auVar50;
  local_1090 = ray;
  iVar43 = iVar42;
  iVar44 = iVar42;
  iVar45 = iVar42;
  fVar39 = fVar86;
  fVar80 = fVar86;
  fVar76 = fVar86;
  fVar40 = fVar89;
  fVar81 = fVar89;
  fVar77 = fVar89;
  fVar41 = fVar94;
  fVar51 = fVar94;
  fVar52 = fVar94;
  fVar60 = fVar98;
  fVar61 = fVar98;
  fVar62 = fVar98;
  fVar63 = fVar88;
  fVar64 = fVar88;
  fVar82 = fVar88;
  fVar90 = fVar99;
  fVar91 = fVar99;
  fVar92 = fVar99;
  fVar93 = fVar87;
  fVar95 = fVar87;
  fVar96 = fVar87;
  fVar97 = fVar78;
  fVar100 = fVar78;
  fVar101 = fVar78;
  do {
    pauVar17 = pauVar21 + -1;
    pauVar21 = pauVar21 + -1;
    if (*(float *)((long)*pauVar17 + 8) < *(float *)(ray + k * 4 + 0x80) ||
        *(float *)((long)*pauVar17 + 8) == *(float *)(ray + k * 4 + 0x80)) {
      uVar25 = *(ulong *)*pauVar21;
      while ((uVar25 & 8) == 0) {
        fVar6 = *(float *)(ray + k * 4 + 0x70);
        uVar23 = (uint)uVar25 & 7;
        uVar22 = uVar25 & 0xfffffffffffffff0;
        if (uVar23 == 3) {
          local_f98 = *(float *)(uVar22 + 0x20);
          fStack_f94 = *(float *)(uVar22 + 0x24);
          fStack_f90 = *(float *)(uVar22 + 0x28);
          fStack_f8c = *(float *)(uVar22 + 0x2c);
          local_1018 = *(undefined8 *)(uVar22 + 0x30);
          uStack_1010 = *(undefined8 *)(uVar22 + 0x38);
          uVar19 = local_1018;
          uVar20 = uStack_1010;
          local_fb8 = *(float *)(uVar22 + 0x50);
          fStack_fb4 = *(float *)(uVar22 + 0x54);
          fStack_fb0 = *(float *)(uVar22 + 0x58);
          fStack_fac = *(float *)(uVar22 + 0x5c);
          local_fa8 = *(float *)(uVar22 + 0x60);
          fStack_fa4 = *(float *)(uVar22 + 100);
          fStack_fa0 = *(float *)(uVar22 + 0x68);
          fStack_f9c = *(float *)(uVar22 + 0x6c);
          local_fd8 = *(float *)(uVar22 + 0x80);
          fStack_fd4 = *(float *)(uVar22 + 0x84);
          fStack_fd0 = *(float *)(uVar22 + 0x88);
          fStack_fcc = *(float *)(uVar22 + 0x8c);
          local_fc8 = *(float *)(uVar22 + 0x90);
          fStack_fc4 = *(float *)(uVar22 + 0x94);
          fStack_fc0 = *(float *)(uVar22 + 0x98);
          fStack_fbc = *(float *)(uVar22 + 0x9c);
          local_1028 = *(undefined8 *)(uVar22 + 0xa0);
          uStack_1020 = *(undefined8 *)(uVar22 + 0xa8);
          uVar11 = local_1028;
          uVar18 = uStack_1020;
          fVar82 = 1.0 - fVar6;
          fVar99 = fVar82 * 0.0;
          local_f88 = *(float *)(uVar22 + 0x110) * fVar6 + fVar82;
          fStack_f84 = *(float *)(uVar22 + 0x114) * fVar6 + fVar82;
          fStack_f80 = *(float *)(uVar22 + 0x118) * fVar6 + fVar82;
          fStack_f7c = *(float *)(uVar22 + 0x11c) * fVar6 + fVar82;
          auVar83._0_4_ = local_fe8 * local_f98 + local_ff8 * local_fb8 + local_1008 * local_fd8;
          auVar83._4_4_ =
               fStack_fe4 * fStack_f94 + fStack_ff4 * fStack_fb4 + fStack_1004 * fStack_fd4;
          auVar83._8_4_ =
               fStack_fe0 * fStack_f90 + fStack_ff0 * fStack_fb0 + fStack_1000 * fStack_fd0;
          auVar83._12_4_ =
               fStack_fdc * fStack_f8c + fStack_fec * fStack_fac + fStack_ffc * fStack_fcc;
          fVar87 = (float)DAT_01f80d30;
          fVar88 = DAT_01f80d30._4_4_;
          fVar86 = DAT_01f80d30._8_4_;
          fVar89 = DAT_01f80d30._12_4_;
          auVar66._4_4_ = -(uint)(ABS(auVar83._4_4_) < fVar88);
          auVar66._0_4_ = -(uint)(ABS(auVar83._0_4_) < fVar87);
          auVar66._8_4_ = -(uint)(ABS(auVar83._8_4_) < fVar86);
          auVar66._12_4_ = -(uint)(ABS(auVar83._12_4_) < fVar89);
          auVar84 = blendvps(auVar83,_DAT_01f80d30,auVar66);
          local_1018._4_4_ = (float)((ulong)local_1018 >> 0x20);
          uStack_1010._4_4_ = (float)((ulong)uStack_1010 >> 0x20);
          auVar68._0_4_ =
               local_fe8 * (float)local_1018 + local_ff8 * local_fa8 + local_1008 * local_fc8;
          auVar68._4_4_ =
               fStack_fe4 * local_1018._4_4_ + fStack_ff4 * fStack_fa4 + fStack_1004 * fStack_fc4;
          auVar68._8_4_ =
               fStack_fe0 * (float)uStack_1010 + fStack_ff0 * fStack_fa0 + fStack_1000 * fStack_fc0;
          auVar68._12_4_ =
               fStack_fdc * uStack_1010._4_4_ + fStack_fec * fStack_f9c + fStack_ffc * fStack_fbc;
          auVar72._4_4_ = -(uint)(ABS(auVar68._4_4_) < fVar88);
          auVar72._0_4_ = -(uint)(ABS(auVar68._0_4_) < fVar87);
          auVar72._8_4_ = -(uint)(ABS(auVar68._8_4_) < fVar86);
          auVar72._12_4_ = -(uint)(ABS(auVar68._12_4_) < fVar89);
          auVar66 = blendvps(auVar68,_DAT_01f80d30,auVar72);
          local_1028._4_4_ = (float)((ulong)local_1028 >> 0x20);
          uStack_1020._4_4_ = (float)((ulong)uStack_1020 >> 0x20);
          auVar56._0_4_ =
               local_fe8 * *(float *)(uVar22 + 0x40) +
               local_ff8 * *(float *)(uVar22 + 0x70) + local_1008 * (float)local_1028;
          auVar56._4_4_ =
               fStack_fe4 * *(float *)(uVar22 + 0x44) +
               fStack_ff4 * *(float *)(uVar22 + 0x74) + fStack_1004 * local_1028._4_4_;
          auVar56._8_4_ =
               fStack_fe0 * *(float *)(uVar22 + 0x48) +
               fStack_ff0 * *(float *)(uVar22 + 0x78) + fStack_1000 * (float)uStack_1020;
          auVar56._12_4_ =
               fStack_fdc * *(float *)(uVar22 + 0x4c) +
               fStack_fec * *(float *)(uVar22 + 0x7c) + fStack_ffc * uStack_1020._4_4_;
          auVar75._4_4_ = -(uint)(ABS(auVar56._4_4_) < fVar88);
          auVar75._0_4_ = -(uint)(ABS(auVar56._0_4_) < fVar87);
          auVar75._8_4_ = -(uint)(ABS(auVar56._8_4_) < fVar86);
          auVar75._12_4_ = -(uint)(ABS(auVar56._12_4_) < fVar89);
          auVar29 = blendvps(auVar56,_DAT_01f80d30,auVar75);
          auVar50 = rcpps(auVar75,auVar84);
          fVar87 = auVar50._0_4_;
          fVar89 = auVar50._4_4_;
          fVar80 = auVar50._8_4_;
          fVar81 = auVar50._12_4_;
          fVar87 = (1.0 - auVar84._0_4_ * fVar87) * fVar87 + fVar87;
          fVar89 = (1.0 - auVar84._4_4_ * fVar89) * fVar89 + fVar89;
          fVar80 = (1.0 - auVar84._8_4_ * fVar80) * fVar80 + fVar80;
          fVar81 = (1.0 - auVar84._12_4_ * fVar81) * fVar81 + fVar81;
          auVar50 = rcpps(auVar50,auVar66);
          fVar88 = auVar50._0_4_;
          auVar69._0_4_ = auVar66._0_4_ * fVar88;
          fVar94 = auVar50._4_4_;
          auVar69._4_4_ = auVar66._4_4_ * fVar94;
          fVar76 = auVar50._8_4_;
          auVar69._8_4_ = auVar66._8_4_ * fVar76;
          fVar77 = auVar50._12_4_;
          auVar69._12_4_ = auVar66._12_4_ * fVar77;
          fVar88 = (1.0 - auVar69._0_4_) * fVar88 + fVar88;
          fVar94 = (1.0 - auVar69._4_4_) * fVar94 + fVar94;
          fVar76 = (1.0 - auVar69._8_4_) * fVar76 + fVar76;
          fVar77 = (1.0 - auVar69._12_4_) * fVar77 + fVar77;
          auVar50 = rcpps(auVar69,auVar29);
          fVar86 = auVar50._0_4_;
          fVar39 = auVar50._4_4_;
          fVar40 = auVar50._8_4_;
          fVar41 = auVar50._12_4_;
          fVar86 = (1.0 - auVar29._0_4_ * fVar86) * fVar86 + fVar86;
          fVar39 = (1.0 - auVar29._4_4_ * fVar39) * fVar39 + fVar39;
          fVar40 = (1.0 - auVar29._8_4_ * fVar40) * fVar40 + fVar40;
          fVar41 = (1.0 - auVar29._12_4_ * fVar41) * fVar41 + fVar41;
          fVar51 = local_f98 * local_1038 +
                   local_fb8 * local_10b8 + local_fd8 * fVar5 + *(float *)(uVar22 + 0xb0);
          fVar98 = fStack_f94 * fStack_1034 +
                   fStack_fb4 * fStack_10b4 + fStack_fd4 * fVar5 + *(float *)(uVar22 + 0xb4);
          fVar61 = fStack_f90 * fStack_1030 +
                   fStack_fb0 * fStack_10b0 + fStack_fd0 * fVar5 + *(float *)(uVar22 + 0xb8);
          fVar63 = fStack_f8c * fStack_102c +
                   fStack_fac * fStack_10ac + fStack_fcc * fVar5 + *(float *)(uVar22 + 0xbc);
          fVar52 = (float)local_1018 * local_1038 +
                   local_fa8 * local_10b8 + local_fc8 * fVar5 + *(float *)(uVar22 + 0xc0);
          fVar60 = local_1018._4_4_ * fStack_1034 +
                   fStack_fa4 * fStack_10b4 + fStack_fc4 * fVar5 + *(float *)(uVar22 + 0xc4);
          fVar62 = (float)uStack_1010 * fStack_1030 +
                   fStack_fa0 * fStack_10b0 + fStack_fc0 * fVar5 + *(float *)(uVar22 + 200);
          fVar64 = uStack_1010._4_4_ * fStack_102c +
                   fStack_f9c * fStack_10ac + fStack_fbc * fVar5 + *(float *)(uVar22 + 0xcc);
          fVar100 = *(float *)(uVar22 + 0x40) * local_1038 +
                    *(float *)(uVar22 + 0x70) * local_10b8 +
                    (float)local_1028 * fVar5 + *(float *)(uVar22 + 0xd0);
          fVar101 = *(float *)(uVar22 + 0x44) * fStack_1034 +
                    *(float *)(uVar22 + 0x74) * fStack_10b4 +
                    local_1028._4_4_ * fVar5 + *(float *)(uVar22 + 0xd4);
          fVar102 = *(float *)(uVar22 + 0x48) * fStack_1030 +
                    *(float *)(uVar22 + 0x78) * fStack_10b0 +
                    (float)uStack_1020 * fVar5 + *(float *)(uVar22 + 0xd8);
          fVar103 = *(float *)(uVar22 + 0x4c) * fStack_102c +
                    *(float *)(uVar22 + 0x7c) * fStack_10ac +
                    uStack_1020._4_4_ * fVar5 + *(float *)(uVar22 + 0xdc);
          fVar95 = ((*(float *)(uVar22 + 0xe0) * fVar6 + fVar99) - fVar51) * fVar87;
          fVar96 = ((*(float *)(uVar22 + 0xe4) * fVar6 + fVar99) - fVar98) * fVar89;
          fVar78 = ((*(float *)(uVar22 + 0xe8) * fVar6 + fVar99) - fVar61) * fVar80;
          fVar97 = ((*(float *)(uVar22 + 0xec) * fVar6 + fVar99) - fVar63) * fVar81;
          fVar87 = (local_f88 - fVar51) * fVar87;
          fVar89 = (fStack_f84 - fVar98) * fVar89;
          fVar80 = (fStack_f80 - fVar61) * fVar80;
          fVar81 = (fStack_f7c - fVar63) * fVar81;
          fVar90 = ((*(float *)(uVar22 + 0xf0) * fVar6 + fVar99) - fVar52) * fVar88;
          fVar91 = ((*(float *)(uVar22 + 0xf4) * fVar6 + fVar99) - fVar60) * fVar94;
          fVar92 = ((*(float *)(uVar22 + 0xf8) * fVar6 + fVar99) - fVar62) * fVar76;
          fVar93 = ((*(float *)(uVar22 + 0xfc) * fVar6 + fVar99) - fVar64) * fVar77;
          fVar51 = ((fVar99 + *(float *)(uVar22 + 0x100) * fVar6) - fVar100) * fVar86;
          fVar98 = ((fVar99 + *(float *)(uVar22 + 0x104) * fVar6) - fVar101) * fVar39;
          fVar61 = ((fVar99 + *(float *)(uVar22 + 0x108) * fVar6) - fVar102) * fVar40;
          fVar63 = ((fVar99 + *(float *)(uVar22 + 0x10c) * fVar6) - fVar103) * fVar41;
          fVar88 = ((*(float *)(uVar22 + 0x120) * fVar6 + fVar82) - fVar52) * fVar88;
          fVar94 = ((*(float *)(uVar22 + 0x124) * fVar6 + fVar82) - fVar60) * fVar94;
          fVar76 = ((*(float *)(uVar22 + 0x128) * fVar6 + fVar82) - fVar62) * fVar76;
          fVar77 = ((*(float *)(uVar22 + 300) * fVar6 + fVar82) - fVar64) * fVar77;
          fVar86 = ((fVar6 * *(float *)(uVar22 + 0x130) + fVar82) - fVar100) * fVar86;
          fVar39 = ((fVar6 * *(float *)(uVar22 + 0x134) + fVar82) - fVar101) * fVar39;
          fVar40 = ((fVar6 * *(float *)(uVar22 + 0x138) + fVar82) - fVar102) * fVar40;
          fVar41 = ((fVar6 * *(float *)(uVar22 + 0x13c) + fVar82) - fVar103) * fVar41;
          auVar84._0_4_ =
               (uint)((int)fVar88 < (int)fVar90) * (int)fVar88 |
               (uint)((int)fVar88 >= (int)fVar90) * (int)fVar90;
          auVar84._4_4_ =
               (uint)((int)fVar94 < (int)fVar91) * (int)fVar94 |
               (uint)((int)fVar94 >= (int)fVar91) * (int)fVar91;
          auVar84._8_4_ =
               (uint)((int)fVar76 < (int)fVar92) * (int)fVar76 |
               (uint)((int)fVar76 >= (int)fVar92) * (int)fVar92;
          auVar84._12_4_ =
               (uint)((int)fVar77 < (int)fVar93) * (int)fVar77 |
               (uint)((int)fVar77 >= (int)fVar93) * (int)fVar93;
          auVar57._0_4_ =
               (uint)((int)fVar86 < (int)fVar51) * (int)fVar86 |
               (uint)((int)fVar86 >= (int)fVar51) * (int)fVar51;
          auVar57._4_4_ =
               (uint)((int)fVar39 < (int)fVar98) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar98) * (int)fVar98;
          auVar57._8_4_ =
               (uint)((int)fVar40 < (int)fVar61) * (int)fVar40 |
               (uint)((int)fVar40 >= (int)fVar61) * (int)fVar61;
          auVar57._12_4_ =
               (uint)((int)fVar41 < (int)fVar63) * (int)fVar41 |
               (uint)((int)fVar41 >= (int)fVar63) * (int)fVar63;
          auVar50 = maxps(auVar84,auVar57);
          auVar58._0_4_ =
               (uint)((int)fVar87 < (int)fVar95) * (int)fVar87 |
               (uint)((int)fVar87 >= (int)fVar95) * (int)fVar95;
          auVar58._4_4_ =
               (uint)((int)fVar89 < (int)fVar96) * (int)fVar89 |
               (uint)((int)fVar89 >= (int)fVar96) * (int)fVar96;
          auVar58._8_4_ =
               (uint)((int)fVar80 < (int)fVar78) * (int)fVar80 |
               (uint)((int)fVar80 >= (int)fVar78) * (int)fVar78;
          auVar58._12_4_ =
               (uint)((int)fVar81 < (int)fVar97) * (int)fVar81 |
               (uint)((int)fVar81 >= (int)fVar97) * (int)fVar97;
          auVar85._0_4_ =
               (uint)((int)fVar88 < (int)fVar90) * (int)fVar90 |
               (uint)((int)fVar88 >= (int)fVar90) * (int)fVar88;
          auVar85._4_4_ =
               (uint)((int)fVar94 < (int)fVar91) * (int)fVar91 |
               (uint)((int)fVar94 >= (int)fVar91) * (int)fVar94;
          auVar85._8_4_ =
               (uint)((int)fVar76 < (int)fVar92) * (int)fVar92 |
               (uint)((int)fVar76 >= (int)fVar92) * (int)fVar76;
          auVar85._12_4_ =
               (uint)((int)fVar77 < (int)fVar93) * (int)fVar93 |
               (uint)((int)fVar77 >= (int)fVar93) * (int)fVar77;
          auVar47._0_4_ =
               (uint)((int)fVar86 < (int)fVar51) * (int)fVar51 |
               (uint)((int)fVar86 >= (int)fVar51) * (int)fVar86;
          auVar47._4_4_ =
               (uint)((int)fVar39 < (int)fVar98) * (int)fVar98 |
               (uint)((int)fVar39 >= (int)fVar98) * (int)fVar39;
          auVar47._8_4_ =
               (uint)((int)fVar40 < (int)fVar61) * (int)fVar61 |
               (uint)((int)fVar40 >= (int)fVar61) * (int)fVar40;
          auVar47._12_4_ =
               (uint)((int)fVar41 < (int)fVar63) * (int)fVar63 |
               (uint)((int)fVar41 >= (int)fVar63) * (int)fVar41;
          auVar72 = minps(auVar85,auVar47);
          auVar29 = maxps(local_10d8,auVar58);
          auVar66 = maxps(auVar29,auVar50);
          auVar30._4_4_ = iVar43;
          auVar30._0_4_ = iVar42;
          auVar30._8_4_ = iVar44;
          auVar30._12_4_ = iVar45;
          auVar29._4_4_ =
               (uint)((int)fVar89 < (int)fVar96) * (int)fVar96 |
               (uint)((int)fVar89 >= (int)fVar96) * (int)fVar89;
          auVar29._0_4_ =
               (uint)((int)fVar87 < (int)fVar95) * (int)fVar95 |
               (uint)((int)fVar87 >= (int)fVar95) * (int)fVar87;
          auVar29._8_4_ =
               (uint)((int)fVar80 < (int)fVar78) * (int)fVar78 |
               (uint)((int)fVar80 >= (int)fVar78) * (int)fVar80;
          auVar29._12_4_ =
               (uint)((int)fVar81 < (int)fVar97) * (int)fVar97 |
               (uint)((int)fVar81 >= (int)fVar97) * (int)fVar81;
          auVar50 = minps(auVar30,auVar29);
          auVar50 = minps(auVar50,auVar72);
          local_10e8._0_4_ = auVar66._0_4_ * 0.99999964;
          local_10e8._4_4_ = auVar66._4_4_ * 0.99999964;
          fStack_10e0 = auVar66._8_4_ * 0.99999964;
          fStack_10dc = auVar66._12_4_ * 0.99999964;
          auVar48._4_4_ = -(uint)((float)local_10e8._4_4_ <= auVar50._4_4_ * 1.0000004);
          auVar48._0_4_ = -(uint)((float)local_10e8._0_4_ <= auVar50._0_4_ * 1.0000004);
          auVar48._8_4_ = -(uint)(fStack_10e0 <= auVar50._8_4_ * 1.0000004);
          auVar48._12_4_ = -(uint)(fStack_10dc <= auVar50._12_4_ * 1.0000004);
          uVar23 = movmskps(3,auVar48);
          auVar50 = local_10d8;
          fVar86 = local_1048;
          fVar39 = fStack_1044;
          fVar80 = fStack_1040;
          fVar76 = fStack_103c;
          fVar89 = local_1058;
          fVar40 = fStack_1054;
          fVar81 = fStack_1050;
          fVar77 = fStack_104c;
          fVar94 = local_1068;
          fVar41 = fStack_1064;
          fVar51 = fStack_1060;
          fVar52 = fStack_105c;
          fVar98 = local_1078;
          fVar60 = fStack_1074;
          fVar61 = fStack_1070;
          fVar62 = fStack_106c;
          fVar88 = local_10b8;
          fVar63 = fStack_10b4;
          fVar64 = fStack_10b0;
          fVar82 = fStack_10ac;
          fVar99 = local_1088;
          fVar90 = fStack_1084;
          fVar91 = fStack_1080;
          fVar92 = fStack_107c;
          fVar87 = local_1038;
          fVar93 = fStack_1034;
          fVar95 = fStack_1030;
          fVar96 = fStack_102c;
          fVar78 = local_10c8;
          fVar97 = fStack_10c4;
          fVar100 = fStack_10c0;
          fVar101 = fStack_10bc;
          local_1028 = uVar11;
          uStack_1020 = uVar18;
          local_1018 = uVar19;
          uStack_1010 = uVar20;
        }
        else {
          pfVar3 = (float *)(uVar22 + 0x80 + uVar26);
          pfVar1 = (float *)(uVar22 + 0x20 + uVar26);
          pfVar4 = (float *)(uVar22 + 0x80 + uVar24);
          pfVar2 = (float *)(uVar22 + 0x20 + uVar24);
          auVar53._0_4_ = ((*pfVar3 * fVar6 + *pfVar1) - fVar87) * fVar99;
          auVar53._4_4_ = ((pfVar3[1] * fVar6 + pfVar1[1]) - fVar93) * fVar90;
          auVar53._8_4_ = ((pfVar3[2] * fVar6 + pfVar1[2]) - fVar95) * fVar91;
          auVar53._12_4_ = ((pfVar3[3] * fVar6 + pfVar1[3]) - fVar96) * fVar92;
          auVar65._0_4_ = ((*pfVar4 * fVar6 + *pfVar2) - fVar88) * fVar78;
          auVar65._4_4_ = ((pfVar4[1] * fVar6 + pfVar2[1]) - fVar63) * fVar97;
          auVar65._8_4_ = ((pfVar4[2] * fVar6 + pfVar2[2]) - fVar64) * fVar100;
          auVar65._12_4_ = ((pfVar4[3] * fVar6 + pfVar2[3]) - fVar82) * fVar101;
          pfVar2 = (float *)(uVar22 + 0x80 + uVar27);
          pfVar1 = (float *)(uVar22 + 0x20 + uVar27);
          auVar28._0_4_ = ((*pfVar2 * fVar6 + *pfVar1) - fVar5) * fVar98;
          auVar28._4_4_ = ((pfVar2[1] * fVar6 + pfVar1[1]) - fVar5) * fVar60;
          auVar28._8_4_ = ((pfVar2[2] * fVar6 + pfVar1[2]) - fVar5) * fVar61;
          auVar28._12_4_ = ((pfVar2[3] * fVar6 + pfVar1[3]) - fVar5) * fVar62;
          auVar66 = maxps(auVar65,auVar28);
          auVar29 = maxps(auVar50,auVar53);
          pfVar2 = (float *)(uVar22 + 0x80 + (uVar26 ^ 0x10));
          pfVar1 = (float *)(uVar22 + 0x20 + (uVar26 ^ 0x10));
          _local_10e8 = maxps(auVar29,auVar66);
          auVar73._0_4_ = ((*pfVar2 * fVar6 + *pfVar1) - fVar87) * fVar86;
          auVar73._4_4_ = ((pfVar2[1] * fVar6 + pfVar1[1]) - fVar93) * fVar39;
          auVar73._8_4_ = ((pfVar2[2] * fVar6 + pfVar1[2]) - fVar95) * fVar80;
          auVar73._12_4_ = ((pfVar2[3] * fVar6 + pfVar1[3]) - fVar96) * fVar76;
          pfVar3 = (float *)(uVar22 + 0x80 + (uVar24 ^ 0x10));
          pfVar1 = (float *)(uVar22 + 0x20 + (uVar24 ^ 0x10));
          pfVar4 = (float *)(uVar22 + 0x80 + (uVar27 ^ 0x10));
          pfVar2 = (float *)(uVar22 + 0x20 + (uVar27 ^ 0x10));
          auVar67._0_4_ = ((*pfVar3 * fVar6 + *pfVar1) - fVar88) * fVar89;
          auVar67._4_4_ = ((pfVar3[1] * fVar6 + pfVar1[1]) - fVar63) * fVar40;
          auVar67._8_4_ = ((pfVar3[2] * fVar6 + pfVar1[2]) - fVar64) * fVar81;
          auVar67._12_4_ = ((pfVar3[3] * fVar6 + pfVar1[3]) - fVar82) * fVar77;
          auVar54._0_4_ = ((*pfVar4 * fVar6 + *pfVar2) - fVar5) * fVar94;
          auVar54._4_4_ = ((pfVar4[1] * fVar6 + pfVar2[1]) - fVar5) * fVar41;
          auVar54._8_4_ = ((pfVar4[2] * fVar6 + pfVar2[2]) - fVar5) * fVar51;
          auVar54._12_4_ = ((pfVar4[3] * fVar6 + pfVar2[3]) - fVar5) * fVar52;
          auVar66 = minps(auVar67,auVar54);
          auVar55._4_4_ = iVar43;
          auVar55._0_4_ = iVar42;
          auVar55._8_4_ = iVar44;
          auVar55._12_4_ = iVar45;
          auVar29 = minps(auVar55,auVar73);
          auVar29 = minps(auVar29,auVar66);
          if (uVar23 == 6) {
            bVar13 = (fVar6 < *(float *)(uVar22 + 0xf0) && *(float *)(uVar22 + 0xe0) <= fVar6) &&
                     local_10e8._0_4_ <= auVar29._0_4_;
            bVar14 = (fVar6 < *(float *)(uVar22 + 0xf4) && *(float *)(uVar22 + 0xe4) <= fVar6) &&
                     local_10e8._4_4_ <= auVar29._4_4_;
            bVar15 = (fVar6 < *(float *)(uVar22 + 0xf8) && *(float *)(uVar22 + 0xe8) <= fVar6) &&
                     local_10e8._8_4_ <= auVar29._8_4_;
            bVar16 = (fVar6 < *(float *)(uVar22 + 0xfc) && *(float *)(uVar22 + 0xec) <= fVar6) &&
                     local_10e8._12_4_ <= auVar29._12_4_;
          }
          else {
            bVar13 = local_10e8._0_4_ <= auVar29._0_4_;
            bVar14 = local_10e8._4_4_ <= auVar29._4_4_;
            bVar15 = local_10e8._8_4_ <= auVar29._8_4_;
            bVar16 = local_10e8._12_4_ <= auVar29._12_4_;
          }
          auVar46._0_4_ = (uint)bVar13 * -0x80000000;
          auVar46._4_4_ = (uint)bVar14 * -0x80000000;
          auVar46._8_4_ = (uint)bVar15 * -0x80000000;
          auVar46._12_4_ = (uint)bVar16 * -0x80000000;
          uVar23 = movmskps(uVar23,auVar46);
        }
        if (uVar23 == 0) goto LAB_002887b4;
        lVar12 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        uVar25 = *(ulong *)(uVar22 + lVar12 * 8);
        uVar23 = uVar23 - 1 & uVar23;
        if (uVar23 != 0) {
          uVar7 = *(uint *)(local_10e8 + lVar12 * 4);
          lVar12 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar22 + lVar12 * 8);
          uVar8 = *(uint *)(local_10e8 + lVar12 * 4);
          uVar23 = uVar23 - 1 & uVar23;
          if (uVar23 == 0) {
            if (uVar7 < uVar8) {
              *(ulong *)*pauVar21 = uVar10;
              *(uint *)((long)*pauVar21 + 8) = uVar8;
              pauVar21 = pauVar21 + 1;
            }
            else {
              *(ulong *)*pauVar21 = uVar25;
              *(uint *)((long)*pauVar21 + 8) = uVar7;
              pauVar21 = pauVar21 + 1;
              uVar25 = uVar10;
            }
          }
          else {
            auVar49._8_4_ = uVar7;
            auVar49._0_8_ = uVar25;
            auVar49._12_4_ = 0;
            auVar70._8_4_ = uVar8;
            auVar70._0_8_ = uVar10;
            auVar70._12_4_ = 0;
            lVar12 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            uVar11 = *(undefined8 *)(uVar22 + lVar12 * 8);
            iVar9 = *(int *)(local_10e8 + lVar12 * 4);
            auVar59._8_4_ = iVar9;
            auVar59._0_8_ = uVar11;
            auVar59._12_4_ = 0;
            auVar31._8_4_ = -(uint)((int)uVar7 < (int)uVar8);
            uVar23 = uVar23 - 1 & uVar23;
            if (uVar23 == 0) {
              auVar31._4_4_ = auVar31._8_4_;
              auVar31._0_4_ = auVar31._8_4_;
              auVar31._12_4_ = auVar31._8_4_;
              auVar74._8_4_ = uVar8;
              auVar74._0_8_ = uVar10;
              auVar74._12_4_ = 0;
              auVar66 = blendvps(auVar74,auVar49,auVar31);
              auVar29 = blendvps(auVar49,auVar70,auVar31);
              auVar32._8_4_ = -(uint)(auVar66._8_4_ < iVar9);
              auVar32._4_4_ = auVar32._8_4_;
              auVar32._0_4_ = auVar32._8_4_;
              auVar32._12_4_ = auVar32._8_4_;
              auVar71._8_4_ = iVar9;
              auVar71._0_8_ = uVar11;
              auVar71._12_4_ = 0;
              auVar72 = blendvps(auVar71,auVar66,auVar32);
              auVar75 = blendvps(auVar66,auVar59,auVar32);
              auVar33._8_4_ = -(uint)(auVar29._8_4_ < auVar75._8_4_);
              auVar33._4_4_ = auVar33._8_4_;
              auVar33._0_4_ = auVar33._8_4_;
              auVar33._12_4_ = auVar33._8_4_;
              auVar66 = blendvps(auVar75,auVar29,auVar33);
              auVar29 = blendvps(auVar29,auVar75,auVar33);
              *pauVar21 = auVar29;
              pauVar21[1] = auVar66;
              uVar25 = auVar72._0_8_;
              pauVar21 = pauVar21 + 2;
            }
            else {
              lVar12 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              auVar34._4_4_ = auVar31._8_4_;
              auVar34._0_4_ = auVar31._8_4_;
              auVar34._8_4_ = auVar31._8_4_;
              auVar34._12_4_ = auVar31._8_4_;
              auVar72 = blendvps(auVar70,auVar49,auVar34);
              auVar50 = blendvps(auVar49,auVar70,auVar34);
              auVar79._8_4_ = *(int *)(local_10e8 + lVar12 * 4);
              auVar79._0_8_ = *(undefined8 *)(uVar22 + lVar12 * 8);
              auVar79._12_4_ = 0;
              auVar35._8_4_ = -(uint)(iVar9 < *(int *)(local_10e8 + lVar12 * 4));
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar66 = blendvps(auVar79,auVar59,auVar35);
              auVar29 = blendvps(auVar59,auVar79,auVar35);
              auVar36._8_4_ = -(uint)(auVar50._8_4_ < auVar29._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              auVar75 = blendvps(auVar29,auVar50,auVar36);
              auVar50 = blendvps(auVar50,auVar29,auVar36);
              auVar37._8_4_ = -(uint)(auVar72._8_4_ < auVar66._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              auVar29 = blendvps(auVar66,auVar72,auVar37);
              auVar72 = blendvps(auVar72,auVar66,auVar37);
              auVar38._8_4_ = -(uint)(auVar72._8_4_ < auVar75._8_4_);
              auVar38._4_4_ = auVar38._8_4_;
              auVar38._0_4_ = auVar38._8_4_;
              auVar38._12_4_ = auVar38._8_4_;
              auVar66 = blendvps(auVar75,auVar72,auVar38);
              auVar72 = blendvps(auVar72,auVar75,auVar38);
              *pauVar21 = auVar50;
              pauVar21[1] = auVar72;
              pauVar21[2] = auVar66;
              uVar25 = auVar29._0_8_;
              pauVar21 = pauVar21 + 3;
              auVar50 = local_10d8;
              fVar78 = local_10c8;
              fVar97 = fStack_10c4;
              fVar100 = fStack_10c0;
              fVar101 = fStack_10bc;
            }
          }
        }
      }
      (**(code **)((long)local_10a0->leafIntersector +
                  (ulong)*(byte *)(uVar25 & 0xfffffffffffffff0) * 0x40 + 0x10))
                (local_1098,ray,k,context);
      iVar42 = *(int *)(local_1090 + k * 4 + 0x80);
      ray = local_1090;
      iVar43 = iVar42;
      iVar44 = iVar42;
      iVar45 = iVar42;
      auVar50 = local_10d8;
      fVar86 = local_1048;
      fVar39 = fStack_1044;
      fVar80 = fStack_1040;
      fVar76 = fStack_103c;
      fVar89 = local_1058;
      fVar40 = fStack_1054;
      fVar81 = fStack_1050;
      fVar77 = fStack_104c;
      fVar94 = local_1068;
      fVar41 = fStack_1064;
      fVar51 = fStack_1060;
      fVar52 = fStack_105c;
      fVar98 = local_1078;
      fVar60 = fStack_1074;
      fVar61 = fStack_1070;
      fVar62 = fStack_106c;
      fVar88 = local_10b8;
      fVar63 = fStack_10b4;
      fVar64 = fStack_10b0;
      fVar82 = fStack_10ac;
      fVar99 = local_1088;
      fVar90 = fStack_1084;
      fVar91 = fStack_1080;
      fVar92 = fStack_107c;
      fVar87 = local_1038;
      fVar93 = fStack_1034;
      fVar95 = fStack_1030;
      fVar96 = fStack_102c;
      fVar78 = local_10c8;
      fVar97 = fStack_10c4;
      fVar100 = fStack_10c0;
      fVar101 = fStack_10bc;
    }
LAB_002887b4:
    if (pauVar21 == (undefined1 (*) [16])&local_f78) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }